

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

double js_math_sign(double a)

{
  if (a != 0.0) {
    a = *(double *)(&DAT_00179df0 + (ulong)(a < 0.0) * 8);
  }
  return a;
}

Assistant:

static double js_math_sign(double a)
{
    if (isnan(a) || a == 0.0)
        return a;
    if (a < 0)
        return -1;
    else
        return 1;
}